

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O0

void KeccakP1600Round(tKeccakLane *state,uint indexRound)

{
  uint in_ESI;
  tKeccakLane *in_RDI;
  tKeccakLane *in_stack_00000060;
  
  theta((tKeccakLane *)0x1541a7);
  rho(in_RDI);
  pi(in_stack_00000060);
  chi(in_RDI);
  iota(in_RDI,in_ESI);
  return;
}

Assistant:

void KeccakP1600Round(tKeccakLane *state, unsigned int indexRound)
{
#ifdef KeccakReference
    displayRoundNumber(3, indexRound);
#endif

    theta(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After theta", state, 1600);
#endif

    rho(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After rho", state, 1600);
#endif

    pi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After pi", state, 1600);
#endif

    chi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After chi", state, 1600);
#endif

    iota(state, indexRound);
#ifdef KeccakReference
    displayStateAsLanes(3, "After iota", state, 1600);
#endif
}